

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void __thiscall DPSprite::Serialize(DPSprite *this,FArchive *arc)

{
  FArchive *pFVar1;
  
  DObject::Serialize(&this->super_DObject,arc);
  pFVar1 = ::operator<<(arc,(DPSprite **)&this->Next);
  pFVar1 = ::operator<<(pFVar1,(AActor **)&this->Caller);
  pFVar1 = ::operator<<(pFVar1,&this->Owner);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->Flags);
  pFVar1 = ::operator<<(pFVar1,&this->State);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->Tics);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->Sprite);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->Frame);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->ID);
  pFVar1 = FArchive::operator<<(pFVar1,&this->x);
  pFVar1 = FArchive::operator<<(pFVar1,&this->y);
  pFVar1 = FArchive::operator<<(pFVar1,&this->oldx);
  FArchive::operator<<(pFVar1,&this->oldy);
  return;
}

Assistant:

void DPSprite::Serialize(FArchive &arc)
{
	Super::Serialize(arc);

	arc << Next << Caller << Owner << Flags
		<< State << Tics << Sprite << Frame
		<< ID << x << y << oldx << oldy;
}